

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CreationTest.cpp
# Opt level: O3

void __thiscall
TApp_HelpFlagFromDefaultsSubcommands_Test::TestBody(TApp_HelpFlagFromDefaultsSubcommands_Test *this)

{
  bool bVar1;
  App *pAVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  AssertHelper AStack_d8;
  Message local_d0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"--that","");
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Wow","");
  pAVar2 = &(this->super_TApp).app;
  CLI::App::set_help_flag(pAVar2,&local_40,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"app2","");
  pcVar3 = "";
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"","");
  pAVar2 = CLI::App::add_subcommand(pAVar2,&local_80,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  CLI::Option::get_name_abi_cxx11_(&local_c0,pAVar2->help_ptr_,false);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[7]>
            ((internal *)&local_d0,"app2->get_help_ptr()->get_name()","\"--that\"",&local_c0,
             (char (*) [7])"--that");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_c0._M_dataplus._M_p._1_7_,(char)local_c0._M_dataplus._M_p) !=
      &local_c0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_c0._M_dataplus._M_p._1_7_,(char)local_c0._M_dataplus._M_p));
  }
  if (local_d0.ss_.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_c0);
    if (local_c8.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = ((local_c8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0x14a,pcVar3);
    testing::internal::AssertHelper::operator=(&AStack_d8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_d8);
    if (CONCAT71(local_c0._M_dataplus._M_p._1_7_,(char)local_c0._M_dataplus._M_p) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT71(local_c0._M_dataplus._M_p._1_7_,(char)local_c0._M_dataplus._M_p) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_c0._M_dataplus._M_p._1_7_,
                                       (char)local_c0._M_dataplus._M_p) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_c8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)&local_c0,"app2->get_help_ptr()->get_description()","\"Wow\"",
             &pAVar2->help_ptr_->description_,(char (*) [4])"Wow");
  if ((char)local_c0._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_d0);
    if ((undefined8 *)local_c0._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_c0._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/tests/CreationTest.cpp"
               ,0x14b,pcVar3);
    testing::internal::AssertHelper::operator=(&AStack_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_d8);
    if (CONCAT71(local_d0.ss_.ptr_._1_7_,local_d0.ss_.ptr_._0_1_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT71(local_d0.ss_.ptr_._1_7_,local_d0.ss_.ptr_._0_1_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_d0.ss_.ptr_._1_7_,local_d0.ss_.ptr_._0_1_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_c0._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST_F(TApp, HelpFlagFromDefaultsSubcommands) {
    app.set_help_flag("--that", "Wow");

    auto app2 = app.add_subcommand("app2");

    EXPECT_EQ(app2->get_help_ptr()->get_name(), "--that");
    EXPECT_EQ(app2->get_help_ptr()->get_description(), "Wow");
}